

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionController::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionController *this,
          Txid *txid,uint32_t vout,Amount *asset_amount,Script *asset_locking_script,
          ByteData *asset_nonce,Amount *token_amount,Script *token_locking_script,
          ByteData *token_nonce,bool is_blind,ByteData256 *contract_hash,bool is_random_sort,
          bool is_remove_nonce)

{
  uint32_t tx_in_index;
  ConfidentialTransaction *this_00;
  ConfidentialNonce confidential_token_nonce;
  ConfidentialNonce confidential_asset_nonce;
  IssuanceParameter local_a0;
  
  this_00 = &this->transaction_;
  tx_in_index = core::ConfidentialTransaction::GetTxInIndex(this_00,txid,vout);
  core::ConfidentialNonce::ConfidentialNonce(&confidential_asset_nonce);
  core::ConfidentialNonce::ConfidentialNonce(&confidential_token_nonce);
  if (!is_remove_nonce) {
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_a0,asset_nonce);
    core::ConfidentialNonce::operator=(&confidential_asset_nonce,(ConfidentialNonce *)&local_a0);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_a0);
    core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_a0,token_nonce);
    core::ConfidentialNonce::operator=(&confidential_token_nonce,(ConfidentialNonce *)&local_a0);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_a0);
  }
  core::IssuanceParameter::IssuanceParameter(__return_storage_ptr__);
  core::ConfidentialTransaction::SetAssetIssuance
            (&local_a0,this_00,tx_in_index,asset_amount,asset_locking_script,
             &confidential_asset_nonce,token_amount,token_locking_script,&confidential_token_nonce,
             is_blind,contract_hash);
  core::IssuanceParameter::operator=(__return_storage_ptr__,&local_a0);
  core::IssuanceParameter::~IssuanceParameter(&local_a0);
  if (is_random_sort) {
    core::ConfidentialTransaction::RandomSortTxOut(this_00);
  }
  core::ConfidentialNonce::~ConfidentialNonce(&confidential_token_nonce);
  core::ConfidentialNonce::~ConfidentialNonce(&confidential_asset_nonce);
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionController::SetAssetIssuance(
    const Txid& txid, uint32_t vout, const Amount& asset_amount,
    const Script& asset_locking_script, const ByteData& asset_nonce,
    const Amount& token_amount, const Script& token_locking_script,
    const ByteData& token_nonce, bool is_blind,
    const ByteData256& contract_hash, bool is_random_sort,
    bool is_remove_nonce) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);

  ConfidentialNonce confidential_asset_nonce;
  ConfidentialNonce confidential_token_nonce;
  if (!is_remove_nonce) {
    confidential_asset_nonce = ConfidentialNonce(asset_nonce);
    confidential_token_nonce = ConfidentialNonce(token_nonce);
  }

  IssuanceParameter param;
  param = transaction_.SetAssetIssuance(
      txin_index, asset_amount, asset_locking_script, confidential_asset_nonce,
      token_amount, token_locking_script, confidential_token_nonce, is_blind,
      contract_hash);
  if (is_random_sort) {
    RandomSortTxOut();
  }
  return param;
}